

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  lest local_40 [39];
  bool local_19;
  expression_lhs *local_18;
  expression_lhs<const_bool_&> *this_local;
  
  local_19 = (bool)(**(byte **)this & 1);
  local_18 = this;
  this_local = (expression_lhs<const_bool_&> *)__return_storage_ptr__;
  to_string_abi_cxx11_(local_40,(bool)(**(byte **)this & 1));
  result::result<bool>(__return_storage_ptr__,&local_19,(text *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }